

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_test.cc
# Opt level: O2

Test * ParserTestMissingSubNinja::Create(void)

{
  Test *this;
  
  this = (Test *)operator_new(0x1e8);
  ParserTestMissingSubNinja((ParserTestMissingSubNinja *)this);
  g_current_test = this;
  return this;
}

Assistant:

TEST_F(ParserTest, MissingSubNinja) {
  ManifestParser parser(&state, &fs_);
  string err;
  EXPECT_FALSE(parser.ParseTest("subninja foo.ninja\n", &err));
  EXPECT_EQ("input:1: loading 'foo.ninja': No such file or directory\n"
            "subninja foo.ninja\n"
            "                  ^ near here"
            , err);
}